

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O1

void bignum_rshift(bn *a,bn *b,int nbits)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  int i;
  long lVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (a == (bn *)0x0) {
    __assert_fail("a && \"a is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x161,"void bignum_rshift(struct bn *, struct bn *, int)");
  }
  if (b == (bn *)0x0) {
    __assert_fail("b && \"b is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x162,"void bignum_rshift(struct bn *, struct bn *, int)");
  }
  if (nbits < 0) {
    __assert_fail("nbits >= 0 && \"no negative shifts\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x163,"void bignum_rshift(struct bn *, struct bn *, int)");
  }
  lVar4 = 0;
  do {
    b->array[lVar4] = a->array[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  if (0x1f < (uint)nbits) {
    if ((uint)nbits < 0x400) {
      lVar6 = 1;
      lVar4 = -0x7c;
      do {
        lVar5 = lVar4;
        *(undefined4 *)((long)b->array + lVar5 + 0x7c) =
             *(undefined4 *)((long)b->array + lVar5 + (ulong)((uint)nbits >> 5) * 4 + 0x7c);
        lVar1 = (ulong)(0x20 - ((uint)nbits >> 5)) + lVar6;
        lVar6 = lVar6 + -1;
        lVar4 = lVar5 + 4;
      } while (lVar1 != 2);
      if ((ulong)-lVar6 < 0x1e || lVar6 == -0x1e) {
        memset((void *)((long)b[1].array + lVar5),0,(-(lVar5 + 4) & 0x3fffffffcU) + 4);
      }
    }
    else {
      b->array[0x1c] = 0;
      b->array[0x1d] = 0;
      b->array[0x1e] = 0;
      b->array[0x1f] = 0;
      b->array[0x18] = 0;
      b->array[0x19] = 0;
      b->array[0x1a] = 0;
      b->array[0x1b] = 0;
      b->array[0x14] = 0;
      b->array[0x15] = 0;
      b->array[0x16] = 0;
      b->array[0x17] = 0;
      b->array[0x10] = 0;
      b->array[0x11] = 0;
      b->array[0x12] = 0;
      b->array[0x13] = 0;
      b->array[0xc] = 0;
      b->array[0xd] = 0;
      b->array[0xe] = 0;
      b->array[0xf] = 0;
      b->array[8] = 0;
      b->array[9] = 0;
      b->array[10] = 0;
      b->array[0xb] = 0;
      b->array[4] = 0;
      b->array[5] = 0;
      b->array[6] = 0;
      b->array[7] = 0;
      b->array[0] = 0;
      b->array[1] = 0;
      b->array[2] = 0;
      b->array[3] = 0;
    }
    nbits = nbits & 0x1f;
  }
  if (nbits != 0) {
    lVar4 = 0;
    do {
      bVar3 = (byte)nbits & 0x1f;
      b->array[lVar4] = b->array[lVar4] >> bVar3 | b->array[lVar4 + 1] << 0x20 - bVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x1f);
    b->array[0x1f] = b->array[0x1f] >> ((byte)nbits & 0x1f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void bignum_rshift(struct bn* a, struct bn* b, int nbits)
{
  require(a, "a is null");
  require(b, "b is null");
  require(nbits >= 0, "no negative shifts");
  
  bignum_assign(b, a);
  /* Handle shift in multiples of word-size */
  const int nbits_pr_word = (WORD_SIZE * 8);
  int nwords = nbits / nbits_pr_word;
  if (nwords != 0)
  {
    _rshift_word(b, nwords);
    nbits -= (nwords * nbits_pr_word);
  }

  if (nbits != 0)
  {
    int i;
    for (i = 0; i < (BN_ARRAY_SIZE - 1); ++i)
    {
      b->array[i] = (b->array[i] >> nbits) | (b->array[i + 1] << ((8 * WORD_SIZE) - nbits));
    }
    b->array[i] >>= nbits;
  }
  
}